

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_CURSE(effect_handler_context_t *context)

{
  _Bool _Var1;
  _Bool _Var2;
  wchar_t dam;
  monster_conflict *mon;
  player *p;
  char *buf;
  _Bool fear;
  char note [32];
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  mon = (monster_conflict *)target_get_monster();
  p = player;
  fear = false;
  _Var1 = (player->opts).opt[3];
  context->ident = true;
  if (mon == (monster_conflict *)0x0) {
    msg("No monster selected!");
  }
  else {
    if (_Var1 == false) {
      buf = " dies!";
    }
    else {
      buf = note;
      strnfmt(buf,0x20," dies! (%d)",(ulong)(uint)dam);
      p = player;
    }
    _Var2 = mon_take_hit(mon,p,dam,&fear,buf);
    if (!_Var2) {
      _Var2 = monster_is_visible((monster *)mon);
      if (_Var2) {
        if (_Var1 == false) {
          message_pain(mon,dam);
        }
        else {
          message_pain_show_damage(mon,dam);
        }
        if (fear == true) {
          add_monster_message(mon,L'#',true);
        }
      }
    }
  }
  return mon != (monster_conflict *)0x0;
}

Assistant:

bool effect_handler_CURSE(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	struct monster *mon = target_get_monster();
	bool fear = false;
	bool dead = false;
	bool display_dam = OPT(player, show_damage);
	char note[32];
	const char *passed_note;

	context->ident = true;

	/* Need to choose a monster, not just point */
	if (!mon) {
		msg("No monster selected!");
		return false;
	}

	/* Hit it */
	if (display_dam) {
		strnfmt(note, sizeof(note), " dies! (%d)", dam);
		passed_note = note;
	} else {
		passed_note = " dies!";
	}
	dead = mon_take_hit(mon, player, dam, &fear, passed_note);

	/* Handle fear for surviving monsters */
	if (!dead && monster_is_visible(mon)) {
		if (display_dam) {
			message_pain_show_damage(mon, dam);
		} else {
			message_pain(mon, dam);
		}
		if (fear) {
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
		}
	}

	return true;
}